

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_scrypt_smix_sse2.c
# Opt level: O0

void sse2_blkxor(void *dest,void *src,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong local_60;
  size_t i;
  size_t L;
  __m128i *S;
  __m128i *D;
  size_t len_local;
  void *src_local;
  void *dest_local;
  
  for (local_60 = 0; local_60 < len >> 4; local_60 = local_60 + 1) {
    puVar3 = (ulong *)((long)dest + local_60 * 0x10);
    uVar1 = puVar3[1];
    puVar4 = (ulong *)((long)src + local_60 * 0x10);
    uVar2 = puVar4[1];
    puVar5 = (ulong *)((long)dest + local_60 * 0x10);
    *puVar5 = *puVar3 ^ *puVar4;
    puVar5[1] = uVar1 ^ uVar2;
  }
  return;
}

Assistant:

static void
sse2_blkxor(void * dest, const void * src, size_t len)
{
	__m128i * D = dest;
	const __m128i * S = src;
	size_t L = len / 16;
	size_t i;

	for (i = 0; i < L; i++)
		D[i] = _mm_xor_si128(D[i], S[i]);
}